

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::SGDOptimizer::Clear(SGDOptimizer *this)

{
  if (this->learningrate_ != (DoubleParameter *)0x0) {
    (*(this->learningrate_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->learningrate_ = (DoubleParameter *)0x0;
  if (this->minibatchsize_ != (Int64Parameter *)0x0) {
    (*(this->minibatchsize_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->minibatchsize_ = (Int64Parameter *)0x0;
  if (this->momentum_ != (DoubleParameter *)0x0) {
    (*(this->momentum_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->momentum_ = (DoubleParameter *)0x0;
  return;
}

Assistant:

void SGDOptimizer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SGDOptimizer)
  if (GetArenaNoVirtual() == NULL && learningrate_ != NULL) {
    delete learningrate_;
  }
  learningrate_ = NULL;
  if (GetArenaNoVirtual() == NULL && minibatchsize_ != NULL) {
    delete minibatchsize_;
  }
  minibatchsize_ = NULL;
  if (GetArenaNoVirtual() == NULL && momentum_ != NULL) {
    delete momentum_;
  }
  momentum_ = NULL;
}